

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# olc_art.hpp
# Opt level: O0

get_result * __thiscall
unodb::
olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
::get_internal(get_result *__return_storage_ptr__,
              olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
              *this,art_key_type k)

{
  bool bVar1;
  optional<unodb::qsbr_ptr_span<const_std::byte>_> *poVar2;
  try_get_result_type local_68;
  undefined1 local_48 [8];
  try_get_result_type result;
  olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
  *this_local;
  art_key_type k_local;
  
  result.super__Optional_base<std::optional<unodb::qsbr_ptr_span<const_std::byte>_>,_false,_false>.
  _M_payload.
  super__Optional_payload<std::optional<unodb::qsbr_ptr_span<const_std::byte>_>,_true,_false,_false>
  .super__Optional_payload_base<std::optional<unodb::qsbr_ptr_span<const_std::byte>_>_>._24_8_ =
       this;
  std::optional<std::optional<unodb::qsbr_ptr_span<const_std::byte>_>_>::optional
            ((optional<std::optional<unodb::qsbr_ptr_span<const_std::byte>_>_> *)local_48);
  do {
    try_get(&local_68,this,k);
    std::optional<std::optional<unodb::qsbr_ptr_span<const_std::byte>_>_>::operator=
              ((optional<std::optional<unodb::qsbr_ptr_span<const_std::byte>_>_> *)local_48,
               &local_68);
    std::optional<std::optional<unodb::qsbr_ptr_span<const_std::byte>_>_>::~optional(&local_68);
    bVar1 = std::optional::operator_cast_to_bool((optional *)local_48);
  } while (!bVar1);
  poVar2 = std::optional<std::optional<unodb::qsbr_ptr_span<const_std::byte>_>_>::operator*
                     ((optional<std::optional<unodb::qsbr_ptr_span<const_std::byte>_>_> *)local_48);
  std::optional<unodb::qsbr_ptr_span<const_std::byte>_>::optional(__return_storage_ptr__,poVar2);
  std::optional<std::optional<unodb::qsbr_ptr_span<const_std::byte>_>_>::~optional
            ((optional<std::optional<unodb::qsbr_ptr_span<const_std::byte>_>_> *)local_48);
  return __return_storage_ptr__;
}

Assistant:

typename olc_db<Key, Value>::get_result olc_db<Key, Value>::get_internal(
    art_key_type k) const noexcept {
  try_get_result_type result;

  while (true) {
    result = try_get(k);
    if (result) break;
    // TODO(laurynas): upgrade to write locks to prevent starving after a
    // certain number of failures?
  }

  return *result;
}